

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreeview.cpp
# Opt level: O2

void __thiscall
QTreeViewPrivate::adjustViewOptionsForIndex
          (QTreeViewPrivate *this,QStyleOptionViewItem *option,QModelIndex *current)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  qsizetype qVar4;
  bool bVar5;
  uint uVar6;
  long in_FS_OFFSET;
  int local_7c;
  QArrayDataPointer<QStyleOptionViewItem::ViewItemPosition> local_78;
  QArrayDataPointer<int> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  iVar2 = viewIndex(this,current);
  uVar1 = *(uint *)&(this->viewItems).d.ptr[iVar2].field_0x1c;
  uVar6 = uVar1 << 0x12;
  (option->super_QStyleOption).state.super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
  super_QFlagsStorage<QStyle::StateFlag>.i =
       uVar6 & 0x200000 | (uVar1 & 4) << 0x11 |
       uVar6 & 0x40000 |
       (option->super_QStyleOption).state.super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
       super_QFlagsStorage<QStyle::StateFlag>.i;
  bVar5 = true;
  if (((this->super_QAbstractItemViewPrivate).selectionBehavior & SelectRows) == SelectItems) {
    bVar5 = option->showDecorationSelected;
  }
  option->showDecorationSelected = bVar5;
  local_58.d = (Data *)0x0;
  local_58.ptr = (int *)0x0;
  local_58.size = 0;
  local_78.d = (Data *)0x0;
  local_78.ptr = (ViewItemPosition *)0x0;
  local_78.size = 0;
  if (((this->viewItems).d.ptr[iVar2].field_0x1c & 2) == 0) {
    iVar3 = QHeaderView::count(this->header);
    iVar3 = iVar3 + -1;
    iVar2 = 0;
  }
  else {
    iVar2 = QHeaderView::visualIndex(this->header,0);
    iVar3 = QHeaderView::visualIndex(this->header,0);
  }
  calcLogicalIndices(this,(QList<int> *)&local_58,
                     (QList<QStyleOptionViewItem::ViewItemPosition> *)&local_78,iVar2,iVar3);
  local_7c = current->c;
  qVar4 = QtPrivate::indexOf<int,int>((QList<int> *)&local_58,&local_7c,0);
  option->viewItemPosition = local_78.ptr[(int)qVar4];
  QArrayDataPointer<QStyleOptionViewItem::ViewItemPosition>::~QArrayDataPointer(&local_78);
  QArrayDataPointer<int>::~QArrayDataPointer(&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTreeViewPrivate::adjustViewOptionsForIndex(QStyleOptionViewItem *option, const QModelIndex &current) const
{
    const int row = viewIndex(current); // get the index in viewItems[]
    option->state = option->state | (viewItems.at(row).expanded ? QStyle::State_Open : QStyle::State_None)
                                  | (viewItems.at(row).hasChildren ? QStyle::State_Children : QStyle::State_None)
                                  | (viewItems.at(row).hasMoreSiblings ? QStyle::State_Sibling : QStyle::State_None);

    option->showDecorationSelected = (selectionBehavior & QTreeView::SelectRows)
                                     || option->showDecorationSelected;

    QList<int>
            logicalIndices; // index = visual index of visible columns only. data = logical index.
    QList<QStyleOptionViewItem::ViewItemPosition>
            viewItemPosList; // vector of left/middle/end for each logicalIndex, visible columns
                             // only.
    const bool spanning = viewItems.at(row).spanning;
    const int left = (spanning ? header->visualIndex(0) : 0);
    const int right = (spanning ? header->visualIndex(0) : header->count() - 1 );
    calcLogicalIndices(&logicalIndices, &viewItemPosList, left, right);

    const int visualIndex = logicalIndices.indexOf(current.column());
    option->viewItemPosition = viewItemPosList.at(visualIndex);
}